

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

void __thiscall
testing::ScopedFakeTestPartResultReporter::Init(ScopedFakeTestPartResultReporter *this)

{
  UnitTestImpl *this_00;
  TestPartResultReporterInterface *pTVar1;
  TestPartResultReporterInterface *pTVar2;
  TestPartResultReporterInterface *in_RDI;
  UnitTestImpl *unaff_retaddr;
  UnitTestImpl *impl;
  
  pTVar2 = in_RDI;
  this_00 = internal::GetUnitTestImpl();
  if (*(int *)&in_RDI[1]._vptr_TestPartResultReporterInterface == 1) {
    pTVar1 = internal::UnitTestImpl::GetGlobalTestPartResultReporter(unaff_retaddr);
    in_RDI[2]._vptr_TestPartResultReporterInterface = (_func_int **)pTVar1;
    internal::UnitTestImpl::SetGlobalTestPartResultReporter(unaff_retaddr,pTVar2);
  }
  else {
    pTVar2 = internal::UnitTestImpl::GetTestPartResultReporterForCurrentThread
                       ((UnitTestImpl *)0x138a11);
    in_RDI[2]._vptr_TestPartResultReporterInterface = (_func_int **)pTVar2;
    internal::UnitTestImpl::SetTestPartResultReporterForCurrentThread(this_00,in_RDI);
  }
  return;
}

Assistant:

void ScopedFakeTestPartResultReporter::Init() {
  internal::UnitTestImpl* const impl = internal::GetUnitTestImpl();
  if (intercept_mode_ == INTERCEPT_ALL_THREADS) {
    old_reporter_ = impl->GetGlobalTestPartResultReporter();
    impl->SetGlobalTestPartResultReporter(this);
  } else {
    old_reporter_ = impl->GetTestPartResultReporterForCurrentThread();
    impl->SetTestPartResultReporterForCurrentThread(this);
  }
}